

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IpcQueueHelper.cpp
# Opt level: O0

optional<helics::ActionMessage> * __thiscall
helics::ipc::OwnedQueue::getMessage(OwnedQueue *this,int timeout)

{
  bool bVar1;
  int in_EDX;
  message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_> *in_RSI;
  optional<helics::ActionMessage> *in_RDI;
  ActionMessage cmd;
  bool res_1;
  bool res;
  timetype abs_time;
  uint priority;
  size_t rx_size;
  ptime *in_stack_fffffffffffffec0;
  pointer in_stack_fffffffffffffec8;
  pointer in_stack_fffffffffffffed0;
  optional<helics::ActionMessage> *buffer;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  size_type *in_stack_fffffffffffffef8;
  size_type in_stack_ffffffffffffff00;
  void *in_stack_ffffffffffffff08;
  message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>
  *in_stack_ffffffffffffff10;
  
  buffer = in_RDI;
  if ((in_RSI[5].m_shmem.m_mapped_region.m_size & 0x100000000) == 0) {
    std::optional<helics::ActionMessage>::optional(in_RDI);
    buffer = in_RDI;
  }
  else {
    do {
      do {
        while (-1 < in_EDX) {
          boost::date_time::microsec_clock<boost::posix_time::ptime>::universal_time();
          boost::date_time::subsecond_duration<boost::posix_time::time_duration,_1000L>::
          subsecond_duration<int>
                    ((subsecond_duration<boost::posix_time::time_duration,_1000L> *)
                     in_stack_fffffffffffffed0,(int *)in_stack_fffffffffffffec8,
                     in_stack_fffffffffffffec0);
          boost::date_time::
          base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
          ::operator+=((base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
                        *)in_RDI,(time_duration_type *)in_stack_fffffffffffffed0);
          in_stack_fffffffffffffed0 =
               std::
               unique_ptr<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
               ::operator->((unique_ptr<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
                             *)0x4b5f82);
          std::vector<char,_std::allocator<char>_>::data
                    ((vector<char,_std::allocator<char>_> *)0x4b5f98);
          bVar1 = boost::interprocess::
                  message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>
                  ::timed_receive(in_RSI,buffer,(size_type)in_RDI,
                                  (size_type *)in_stack_fffffffffffffed0,
                                  (uint *)in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
          if (!bVar1) {
            std::optional<helics::ActionMessage>::optional(in_RDI);
            return buffer;
          }
        }
      } while (0 < in_EDX);
      in_stack_fffffffffffffec8 =
           std::
           unique_ptr<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
           ::operator->((unique_ptr<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
                         *)0x4b6001);
      std::vector<char,_std::allocator<char>_>::data
                ((vector<char,_std::allocator<char>_> *)0x4b6017);
      bVar1 = boost::interprocess::
              message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>::
              try_receive(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                          in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                          (uint *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    } while (bVar1);
    std::optional<helics::ActionMessage>::optional(in_RDI);
  }
  return buffer;
}

Assistant:

std::optional<ActionMessage> OwnedQueue::getMessage(int timeout)
    {
        if (!connected) {
            return std::nullopt;
        }
        size_t rx_size = 0;
        unsigned int priority{0};
        while (true) {
            if (timeout >= 0) {
                timetype abs_time = clocktype::universal_time();
                abs_time += boost::posix_time::milliseconds(timeout);
                bool res =
                    rqueue->timed_receive(buffer.data(), mxSize, rx_size, priority, abs_time);
                if (!res) {
                    return std::nullopt;
                }
            } else if (timeout <= 0) {
                bool res = rqueue->try_receive(buffer.data(), mxSize, rx_size, priority);
                if (!res) {
                    return std::nullopt;
                }
            }

            if (rx_size < 8) {
                continue;
            }
            ActionMessage cmd(reinterpret_cast<std::byte*>(buffer.data()), rx_size);
            if (!isValidCommand(cmd)) {
                std::cerr << "invalid command received ipc" << std::endl;
                continue;
            }
            return cmd;
        }
    }